

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

bool RigidBodyDynamics::CalcAssemblyQ
               (Model *model,VectorNd *QInit,ConstraintSet *cs,VectorNd *Q,VectorNd *weights,
               double tolerance,uint max_iter)

{
  double *pdVar1;
  DstEvaluatorType *pDVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  variable_if_dynamic<long,__1> vVar5;
  int iVar6;
  pointer pJVar7;
  RBDLDofMismatchError *pRVar8;
  undefined8 *puVar9;
  pointer pJVar10;
  double *pdVar11;
  bool bVar12;
  ConstraintSet *CS;
  Index othersize;
  double dVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  plainobjectbase_evaluator_data<double,_0> pVar18;
  double *pdVar19;
  Index row;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  VectorNd d;
  VectorNd e;
  ActualDstType actualDst;
  VectorNd b;
  VectorNd x;
  MatrixNd constraintJac;
  DstEvaluatorType dstEvaluator;
  MatrixNd A;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_1c9;
  undefined1 local_1c8 [16];
  DstEvaluatorType local_1b8;
  uint local_19c;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  ConstraintSet *local_180;
  undefined1 local_178 [24];
  XprTypeNested pMStack_160;
  variable_if_dynamic<long,__1> local_158;
  variable_if_dynamic<long,__1> local_150;
  double local_148;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  Vector3d local_e8;
  double local_c8;
  Matrix<double,__1,__1,_0,__1,__1> local_c0;
  ulong local_a8;
  SrcEvaluatorType local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  pMStack_160 = (XprTypeNested)local_178._16_8_;
  uVar20 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_19c = max_iter;
  local_c8 = tolerance;
  if (uVar20 != model->q_size) {
    pRVar8 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Incorrect Q vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar8,&local_50);
    __cxa_throw(pRVar8,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  if ((QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar20) {
    pRVar8 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Incorrect QInit vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar8,&local_70);
    __cxa_throw(pRVar8,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  uVar20 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (uVar20 != model->dof_count) {
    pRVar8 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Incorrect weights vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar8,&local_90);
    __cxa_throw(pRVar8,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  lVar16 = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  if ((model->dof_count != 0 && *(long *)(cs + 0x10) - *(long *)(cs + 8) != 0) &&
     (auVar24._8_8_ = 0, auVar24._0_8_ = uVar20,
     auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff), SUB168(auVar4 / auVar24,0) < lVar16)
     ) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8,QInit,SUB168(auVar4 % auVar24,0));
    *puVar9 = operator_new;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,lVar16 * uVar20,lVar16,uVar20);
  local_178._8_8_ = (ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2);
  local_178._0_8_ = local_178._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pMStack_160;
  stack0xfffffffffffffe98 = auVar4 << 0x40;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_c0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_178);
  dVar13 = (double)((ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2));
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_rows = 0;
  local_180 = cs;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_198,(Index)dVar13,1);
  if ((double)local_198.m_storage.m_rows != dVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_198,(Index)dVar13,1);
    dVar13 = (double)local_198.m_storage.m_rows;
  }
  if (0 < (long)dVar13) {
    memset(local_198.m_storage.m_data,0,(long)dVar13 << 3);
  }
  lVar16 = (ulong)model->dof_count + (*(long *)(local_180 + 0x10) - *(long *)(local_180 + 8) >> 2);
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar16,1);
  if (local_118.m_storage.m_rows != lVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar16,1);
    lVar16 = local_118.m_storage.m_rows;
  }
  if (0 < lVar16) {
    memset(local_118.m_storage.m_data,0,lVar16 << 3);
  }
  uVar20 = (ulong)model->dof_count;
  local_1c8._0_8_ = (double *)0x0;
  local_1c8._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1c8,uVar20,1);
  if (local_1c8._8_8_ != uVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1c8,uVar20,1);
    uVar20 = local_1c8._8_8_;
  }
  if (0 < (long)uVar20) {
    memset((void *)local_1c8._0_8_,0,uVar20 << 3);
  }
  lVar16 = *(long *)(local_180 + 0x10) - *(long *)(local_180 + 8) >> 2;
  local_1b8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = (double *)0x0;
  local_1b8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  ._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1c8 + 0x10),lVar16,1
            );
  if (local_1b8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      ._8_8_ != lVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1c8 + 0x10),lVar16
               ,1);
    lVar16 = local_1b8.
             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             ._8_8_;
  }
  if (0 < lVar16) {
    memset(local_1b8.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           .m_data,0,lVar16 << 3);
  }
  CS = local_180;
  uVar20 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (0 < (long)uVar20) {
    pdVar15 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar14 = 0;
    pdVar11 = local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
    do {
      *pdVar11 = pdVar15[uVar14];
      uVar14 = uVar14 + 1;
      pdVar11 = pdVar11 + local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_rows + 1;
    } while ((uVar14 & 0xffffffff) < uVar20);
  }
  pDVar2 = (DstEvaluatorType *)(local_1c8 + 0x10);
  local_1b8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value = (long)Q;
  CalcConstraintsPositionError(model,QInit,local_180,(VectorNd *)pDVar2,true);
  local_138.m_dst = pDVar2;
  if (local_1b8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      ._8_8_ == 0) {
    dVar13 = 0.0;
  }
  else {
    local_178._8_8_ =
         local_1b8.
         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
         .m_data;
    dVar13 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_178,(scalar_sum_op<double,_double> *)&local_e8,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_138);
  }
  if (local_c8 <= SQRT(dVar13)) {
    if (local_19c != 0) {
      uVar20 = 0;
      do {
        local_a8 = uVar20;
        if (0 < local_108.m_cols * local_108.m_rows) {
          memset(local_108.m_data,0,local_108.m_cols * local_108.m_rows * 8);
        }
        CalcConstraintsJacobian(model,QInit,CS,(MatrixNd *)&local_108,true);
        local_158.m_value = (long)model->dof_count;
        local_178._8_8_ = *(long *)(CS + 0x10) - *(long *)(CS + 8) >> 2;
        local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (double)(local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + local_158.m_value);
        pMStack_160 = &local_c0;
        local_150.m_value = 0;
        local_148 = (double)local_c0.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
        local_a0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.data = local_108.m_data;
        local_a0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.m_outerStride = local_108.m_rows;
        local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] =
             (double)local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
        local_138.m_dst = (DstEvaluatorType *)&local_e8;
        local_138.m_src = &local_a0;
        local_138.m_functor = &local_1c9;
        local_138.m_dstExpr = (DstXprType *)local_178;
        local_178._0_8_ =
             local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        local_178._16_8_ = local_158.m_value;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_138);
        uVar3 = model->dof_count;
        local_158.m_value = (long)uVar3;
        local_178._8_8_ = *(long *)(CS + 0x10) - *(long *)(CS + 8) >> 2;
        if (0 < (long)local_178._8_8_) {
          pdVar11 = local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
                    local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * local_158.m_value;
          pVar18.data = (double *)0x0;
          pdVar15 = local_108.m_data;
          do {
            if (uVar3 != 0) {
              uVar20 = 0;
              pdVar19 = pdVar15;
              do {
                pdVar11[uVar20] = *pdVar19;
                uVar20 = uVar20 + 1;
                pdVar19 = pdVar19 + local_108.m_rows;
              } while (local_158.m_value != uVar20);
            }
            pVar18.data = pVar18.data + 1;
            pdVar15 = pdVar15 + 1;
            pdVar11 = pdVar11 + local_c0.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
          } while (pVar18.data != (double *)local_178._8_8_);
        }
        local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] = (double)(local_198.m_storage.m_data + local_158.m_value);
        local_178._0_8_ =
             local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        pMStack_160 = (XprTypeNested)&local_198;
        local_178._16_8_ = 1;
        local_150.m_value = 0;
        local_148 = (double)local_198.m_storage.m_rows;
        local_a0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.m_outerStride =
             (Index)local_1b8.
                    super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_data;
        local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] = (double)local_198.m_storage.m_rows;
        local_138.m_dst = (DstEvaluatorType *)&local_e8;
        local_138.m_src = &local_a0;
        local_138.m_functor = &local_1c9;
        local_138.m_dstExpr = (DstXprType *)local_178;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)&local_138);
        SolveLinearSystem(&local_c0,(VectorNd *)&local_198,(VectorNd *)&local_118,
                          *(LinearSolver *)CS);
        pdVar15 = local_118.m_storage.m_data;
        uVar20 = (ulong)model->dof_count;
        if (local_1c8._8_8_ != uVar20) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1c8,uVar20,1)
          ;
          uVar20 = local_1c8._8_8_;
        }
        uVar14 = uVar20 & 0xfffffffffffffffe;
        if (0 < (long)uVar14) {
          lVar16 = 0;
          do {
            pdVar11 = pdVar15 + lVar16;
            dVar13 = pdVar11[1];
            *(double *)(local_1c8._0_8_ + lVar16 * 8) = *pdVar11;
            ((double *)(local_1c8._0_8_ + lVar16 * 8))[1] = dVar13;
            lVar16 = lVar16 + 2;
          } while (lVar16 < (long)uVar14);
        }
        if (uVar14 != uVar20) {
          do {
            *(double *)(local_1c8._0_8_ + uVar14 * 8) = pdVar15[uVar14];
            uVar14 = uVar14 + 1;
          } while ((long)uVar14 < (long)uVar20);
        }
        pJVar7 = (model->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pJVar10 = (model->mJoints).
                  super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pJVar10 != pJVar7) {
          uVar20 = 0;
          do {
            if (pJVar7[uVar20].mJointType == JointTypeSpherical) {
              uVar14 = uVar20 & 0xffffffff;
              uVar3 = pJVar7[uVar14].q_index;
              pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              local_178._0_8_ = pdVar15[uVar3];
              local_178._8_8_ =
                   ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                   (pdVar15 + (uVar3 + 1)))->m_d;
              local_178._16_8_ = pdVar15[uVar3 + 2];
              pMStack_160 = (XprTypeNested)
                            pdVar15[(model->multdof3_w_index).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar14]];
              local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] =
                   *(double *)(local_1c8._0_8_ + (ulong)pJVar7[uVar20].q_index * 8);
              local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] =
                   ((double *)(local_1c8._0_8_ + (ulong)pJVar7[uVar20].q_index * 8))[1];
              local_e8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] =
                   *(double *)(local_1c8._0_8_ + ((ulong)pJVar7[uVar20].q_index + 2) * 8);
              Math::Quaternion::omegaToQDot
                        ((Vector4d *)&local_138,(Quaternion *)local_178,&local_e8);
              auVar21._0_8_ = (double)local_138.m_dst + (double)local_178._0_8_;
              auVar21._8_8_ = (double)local_138.m_src + (double)local_178._8_8_;
              auVar22._0_8_ = (double)local_138.m_functor + (double)local_178._16_8_;
              auVar22._8_8_ = (double)local_138.m_dstExpr + (double)pMStack_160;
              auVar23._0_8_ =
                   auVar22._8_8_ * auVar22._8_8_ + auVar21._8_8_ * auVar21._8_8_ +
                   auVar22._0_8_ * auVar22._0_8_ + auVar21._0_8_ * auVar21._0_8_;
              auVar23._8_8_ = 0;
              auVar24 = sqrtpd(auVar23,auVar23);
              auVar25._0_8_ = auVar24._0_8_;
              auVar25._8_8_ = auVar25._0_8_;
              local_178._0_16_ = divpd(auVar21,auVar25);
              register0x00001240 = divpd(auVar22,auVar25);
              pJVar7 = (model->mJoints).
                       super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar3 = pJVar7[uVar14].q_index;
              pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              pdVar15[uVar3] = local_178._0_8_;
              ((evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pdVar15 + (uVar3 + 1)))->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> =
                   (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                   local_178._8_8_;
              pdVar15[uVar3 + 2] = (double)local_178._16_8_;
              pdVar15[(model->multdof3_w_index).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14]] = (double)pMStack_160;
              pJVar10 = (model->mJoints).
                        super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        .
                        super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              uVar3 = pJVar7[uVar20].mDoFCount;
              if ((ulong)uVar3 != 0) {
                uVar14 = (ulong)pJVar7[uVar20].q_index;
                pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                uVar17 = 0;
                do {
                  pdVar15[uVar14 + uVar17] =
                       *(double *)(local_1c8._0_8_ + (uVar14 + uVar17) * 8) +
                       pdVar15[uVar14 + uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar3 != uVar17);
              }
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < (ulong)(((long)pJVar10 - (long)pJVar7 >> 3) * -0x5555555555555555));
        }
        CS = local_180;
        pDVar2 = (DstEvaluatorType *)(local_1c8 + 0x10);
        CalcConstraintsPositionError(model,QInit,local_180,(VectorNd *)pDVar2,true);
        local_138.m_dst = pDVar2;
        if (local_1b8.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            ._8_8_ == 0) {
          dVar13 = 0.0;
        }
        else {
          local_178._8_8_ =
               local_1b8.
               super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_data;
          dVar13 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_178,(scalar_sum_op<double,_double> *)&local_e8,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               *)&local_138);
        }
        iVar6 = (int)local_a8;
        if (SQRT(dVar13) < local_c8) {
          local_138.m_dst = (DstEvaluatorType *)local_1c8;
          if (local_1c8._8_8_ == 0) {
            dVar13 = 0.0;
          }
          else {
            local_178._8_8_ = local_1c8._0_8_;
            dVar13 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_178,(scalar_sum_op<double,_double> *)&local_e8,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_138);
          }
          vVar5.m_value =
               local_1b8.
               super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_outerStride.m_value;
          iVar6 = (int)local_a8;
          if (SQRT(dVar13) < local_c8) {
            pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar20 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if (((DenseStorage<double,__1,__1,_1,_0> *)
                local_1b8.
                super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                .
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                .m_outerStride.m_value)->m_rows != uVar20) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         local_1b8.
                         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_outerStride.m_value,uVar20,1);
              uVar20 = ((DenseStorage<double,__1,__1,_1,_0> *)vVar5.m_value)->m_rows;
            }
            pdVar11 = ((DenseStorage<double,__1,__1,_1,_0> *)vVar5.m_value)->m_data;
            uVar14 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar20) {
              lVar16 = 0;
              do {
                pdVar19 = pdVar15 + lVar16;
                dVar13 = pdVar19[1];
                pdVar1 = pdVar11 + lVar16;
                *pdVar1 = *pdVar19;
                pdVar1[1] = dVar13;
                lVar16 = lVar16 + 2;
              } while (lVar16 < (long)uVar14);
            }
            bVar12 = true;
            if ((long)uVar14 < (long)uVar20) {
              do {
                pdVar11[uVar14] = pdVar15[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar20 != uVar14);
            }
            goto LAB_0013c024;
          }
        }
        uVar20 = (ulong)(iVar6 + 1U);
      } while (iVar6 + 1U != local_19c);
    }
    pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar20 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (((DenseStorage<double,__1,__1,_1,_0> *)
        local_1b8.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value)->m_rows != uVar20) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 local_1b8.
                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_outerStride.m_value,uVar20,1);
      uVar20 = ((DenseStorage<double,__1,__1,_1,_0> *)
               local_1b8.
               super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_outerStride.m_value)->m_rows;
    }
    pdVar11 = ((DenseStorage<double,__1,__1,_1,_0> *)
              local_1b8.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_outerStride.m_value)->m_data;
    uVar14 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar20) {
      lVar16 = 0;
      do {
        pdVar19 = pdVar15 + lVar16;
        dVar13 = pdVar19[1];
        pdVar1 = pdVar11 + lVar16;
        *pdVar1 = *pdVar19;
        pdVar1[1] = dVar13;
        lVar16 = lVar16 + 2;
      } while (lVar16 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar20) {
      do {
        pdVar11[uVar14] = pdVar15[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar20 != uVar14);
    }
    bVar12 = false;
  }
  else {
    pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar20 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (((DenseStorage<double,__1,__1,_1,_0> *)
        local_1b8.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value)->m_rows != uVar20) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 local_1b8.
                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_outerStride.m_value,uVar20,1);
      uVar20 = ((DenseStorage<double,__1,__1,_1,_0> *)
               local_1b8.
               super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_outerStride.m_value)->m_rows;
    }
    pdVar11 = ((DenseStorage<double,__1,__1,_1,_0> *)
              local_1b8.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_outerStride.m_value)->m_data;
    uVar14 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar20) {
      lVar16 = 0;
      do {
        pdVar19 = pdVar15 + lVar16;
        dVar13 = pdVar19[1];
        pdVar1 = pdVar11 + lVar16;
        *pdVar1 = *pdVar19;
        pdVar1[1] = dVar13;
        lVar16 = lVar16 + 2;
      } while (lVar16 < (long)uVar14);
    }
    bVar12 = true;
    if ((long)uVar14 < (long)uVar20) {
      do {
        pdVar11[uVar14] = pdVar15[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar20 != uVar14);
    }
  }
LAB_0013c024:
  free(local_1b8.
       super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_data);
  free((void *)local_1c8._0_8_);
  free(local_118.m_storage.m_data);
  free(local_198.m_storage.m_data);
  free(local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_108.m_data);
  return bVar12;
}

Assistant:

RBDL_DLLAPI
bool CalcAssemblyQ (
  Model &model,
  Math::VectorNd QInit, // Note: passed by value intentionally
  ConstraintSet &cs,
  Math::VectorNd &Q,
  const Math::VectorNd &weights,
  double tolerance,
  unsigned int max_iter
)
{

  if(Q.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect Q vector size.\n");
  }
  if(QInit.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect QInit vector size.\n");
  }
  if(weights.size() != model.dof_count) {
    throw Errors::RBDLDofMismatchError("Incorrect weights vector size.\n");
  }

  // Initialize variables.
  MatrixNd constraintJac (cs.size(), model.dof_count);
  MatrixNd A = MatrixNd::Zero (cs.size() + model.dof_count, cs.size()
                               + model.dof_count);
  VectorNd b = VectorNd::Zero (cs.size() + model.dof_count);
  VectorNd x = VectorNd::Zero (cs.size() + model.dof_count);
  VectorNd d = VectorNd::Zero (model.dof_count);
  VectorNd e = VectorNd::Zero (cs.size());

  // The top-left block is the weight matrix and is constant.
  for(unsigned int i = 0; i < weights.size(); ++i) {
    A(i,i) = weights[i];
  }

  // Check if the error is small enough already. If so, just return the initial
  // guess as the solution.
  CalcConstraintsPositionError (model, QInit, cs, e);
  if (e.norm() < tolerance) {
    Q = QInit;
    return true;
  }

  // We solve the linearized problem iteratively.
  // Iterations are stopped if the maximum is reached.
  for(unsigned int it = 0; it < max_iter; ++it) {
    // Compute the constraint jacobian and build A and b.
    constraintJac.setZero();
    CalcConstraintsJacobian (model, QInit, cs, constraintJac);
    A.block (model.dof_count, 0, cs.size(), model.dof_count) = constraintJac;
    A.block (0, model.dof_count, model.dof_count, cs.size())
      = constraintJac.transpose();
    b.block (model.dof_count, 0, cs.size(), 1) = -e;

    // Solve the sistem A*x = b.
    SolveLinearSystem (A, b, x, cs.linear_solver);

    // Extract the d = (Q - QInit) vector from x.
    d = x.block (0, 0, model.dof_count, 1);

    // Update solution.
    for (size_t i = 0; i < model.mJoints.size(); ++i) {
      // If the joint is spherical, translate the corresponding components
      // of d into a modification in the joint quaternion.
      if (model.mJoints[i].mJointType == JointTypeSpherical) {
        Quaternion quat = model.GetQuaternion(i, QInit);
        Vector3d omega = d.block<3,1>(model.mJoints[i].q_index,0);
        // Convert the 3d representation of the displacement to 4d and sum it
        // to the components of the quaternion.
        quat += quat.omegaToQDot(omega);
        // The quaternion needs to be normalized after the previous sum.
        quat /= quat.norm();
        model.SetQuaternion(i, quat, QInit);
      }
      // If the current joint is not spherical, simply add the corresponding
      // components of d to QInit.
      else {
        unsigned int qIdx = model.mJoints[i].q_index;
        for(size_t j = 0; j < model.mJoints[i].mDoFCount; ++j) {
          QInit[qIdx + j] += d[qIdx + j];
        }
      }
    }

    // Update the errors.
    CalcConstraintsPositionError (model, QInit, cs, e);

    // Check if the error and the step are small enough to end.
    if (e.norm() < tolerance && d.norm() < tolerance) {
      Q = QInit;
      return true;
    }
  }

  // Return false if maximum number of iterations is exceeded.
  Q = QInit;
  return false;
}